

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filter.c
# Opt level: O0

void mafilter(double *sig,int N,int window,double *oup)

{
  int iVar1;
  void *__ptr;
  double dVar2;
  double *temp;
  double sum;
  int local_30;
  int j;
  int i;
  int N2;
  int q;
  int odd;
  double *oup_local;
  int window_local;
  int N_local;
  double *sig_local;
  
  if (window % 2 == 0) {
    i = window / 2;
  }
  else {
    i = (window + -1) / 2;
  }
  iVar1 = N + i * 2;
  __ptr = malloc((long)iVar1 << 3);
  for (local_30 = 0; local_30 < i; local_30 = local_30 + 1) {
    *(double *)((long)__ptr + (long)local_30 * 8) = *sig;
  }
  for (local_30 = i; local_30 < N + i; local_30 = local_30 + 1) {
    *(double *)((long)__ptr + (long)local_30 * 8) = sig[local_30 - i];
  }
  for (local_30 = N + i; local_30 < iVar1; local_30 = local_30 + 1) {
    *(double *)((long)__ptr + (long)local_30 * 8) = sig[N + -1];
  }
  if (window % 2 == 0) {
    for (local_30 = i; local_30 < N + i; local_30 = local_30 + 1) {
      temp = (double *)0x0;
      for (sum._4_4_ = local_30 - i; sum._4_4_ < local_30 + i + 1; sum._4_4_ = sum._4_4_ + 1) {
        if ((sum._4_4_ == local_30 - i) || (sum._4_4_ == local_30 + i)) {
          dVar2 = *(double *)((long)__ptr + (long)sum._4_4_ * 8) * 0.5;
        }
        else {
          dVar2 = *(double *)((long)__ptr + (long)sum._4_4_ * 8);
        }
        temp = (double *)(dVar2 + (double)temp);
      }
      oup[local_30 - i] = (double)temp / (double)window;
    }
  }
  else {
    for (local_30 = i; local_30 < N + i; local_30 = local_30 + 1) {
      temp = (double *)0x0;
      for (sum._4_4_ = local_30 - i; sum._4_4_ < local_30 + i + 1; sum._4_4_ = sum._4_4_ + 1) {
        temp = (double *)(*(double *)((long)__ptr + (long)sum._4_4_ * 8) + (double)temp);
      }
      oup[local_30 - i] = (double)temp / (double)window;
    }
  }
  free(__ptr);
  return;
}

Assistant:

void mafilter(double *sig,int N, int window,double *oup) {
	int odd,q,N2,i,j;
	double sum;
	double *temp;
	/*
	 * mafilter is a moving average filter that smoothes the signal using
	 * a smoothing window. In this implementation, the signal is extended
	 * by the length of the window. Length floor(window/2) extension is carried
	 * out at the beginning of the signal by setting values of the signal
	 * to sig[0]. The rest of the extension is done at the tail of the signal
	 * by setting it equal to sig[N-1].
	 *
	 */
	
	odd = window - ((window/2) * 2);
	
	if (odd) {
		q = (window - 1 ) / 2; 
	} else {
		q = window / 2;
	}
	
	N2 = N + (2 * q);
	
	temp = (double*) malloc (sizeof(double) * N2);
	
	for (i = 0; i < q; ++i) {
		temp[i] = sig[0];
	}
	
	for (i = q; i < N + q; ++i) {
		temp[i] = sig[i - q];
	}
	
	for (i = N + q; i < N2; ++i) {
		temp[i] = sig[N-1];
	}
	
	if (odd) {
		for (i = q; i < N+q; ++i) {
			sum = 0.0;
			for (j = i - q; j < i + q + 1;j++) {
				sum += temp[j];
			}
			oup[i-q] = sum /window;
		}  
	} else {
		for (i = q; i < N+q; ++i) {
			sum = 0.0;
			for (j = i - q; j < i + q + 1;j++) {
				if ( j == i - q || j == i + q) {
					sum += 0.5 * temp[j];
				} else {
					sum += temp[j];
				}
			}
			oup[i-q] = sum /window;
		}  
	}
	
	
	free(temp);
}